

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void sycc422_to_rgb(opj_image_t *img)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  opj_image_comp_t *poVar6;
  int *__ptr;
  uint *__ptr_00;
  uint *__ptr_01;
  uint *__ptr_02;
  ulong uVar7;
  uint uVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  uint *puVar20;
  ulong uVar21;
  int *piVar22;
  int *piVar23;
  size_t __size;
  uint *puVar24;
  float fVar25;
  
  poVar6 = img->comps;
  bVar1 = (byte)poVar6->prec;
  iVar13 = 1 << (bVar1 - 1 & 0x1f);
  uVar14 = poVar6->w;
  uVar21 = (ulong)poVar6->h;
  __ptr = poVar6->data;
  piVar23 = poVar6[1].data;
  piVar22 = poVar6[2].data;
  __size = uVar14 * uVar21 * 4;
  __ptr_00 = (uint *)malloc(__size);
  __ptr_01 = (uint *)malloc(__size);
  __ptr_02 = (uint *)malloc(__size);
  if (__ptr_02 == (uint *)0x0 || (__ptr_01 == (uint *)0x0 || __ptr_00 == (uint *)0x0)) {
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    return;
  }
  if (uVar21 != 0) {
    uVar12 = ~(-1 << (bVar1 & 0x1f));
    uVar8 = img->x0 & 1;
    fVar25 = (float)-iVar13;
    uVar15 = (ulong)uVar14 - (ulong)uVar8;
    uVar16 = uVar15 & 0xfffffffffffffffe;
    uVar7 = 0;
    piVar9 = __ptr;
    puVar19 = __ptr_00;
    puVar20 = __ptr_01;
    puVar24 = __ptr_02;
    do {
      if (uVar8 != 0) {
        iVar2 = *piVar9;
        uVar10 = (int)(fVar25 * 1.402) + iVar2;
        uVar14 = uVar12;
        if ((int)uVar10 < (int)uVar12) {
          uVar14 = uVar10;
        }
        if ((int)uVar10 < 0) {
          uVar14 = 0;
        }
        *puVar19 = uVar14;
        uVar10 = iVar2 - (int)(fVar25 * 0.344 + fVar25 * 0.714);
        uVar14 = uVar12;
        if ((int)uVar10 < (int)uVar12) {
          uVar14 = uVar10;
        }
        if ((int)uVar10 < 0) {
          uVar14 = 0;
        }
        *puVar20 = uVar14;
        uVar10 = iVar2 + (int)(fVar25 * 1.772);
        uVar14 = uVar12;
        if ((int)uVar10 < (int)uVar12) {
          uVar14 = uVar10;
        }
        if ((int)uVar10 < 0) {
          uVar14 = 0;
        }
        *puVar24 = uVar14;
        piVar9 = piVar9 + 1;
        puVar19 = puVar19 + 1;
        puVar20 = puVar20 + 1;
        puVar24 = puVar24 + 1;
      }
      uVar11 = 0;
      if (uVar16 != 0) {
        do {
          iVar2 = *piVar22;
          iVar3 = *piVar9;
          uVar10 = (int)((double)(iVar2 - iVar13) * 1.402) + iVar3;
          uVar14 = uVar10;
          if ((int)uVar12 <= (int)uVar10) {
            uVar14 = uVar12;
          }
          uVar17 = 0;
          if (-1 < (int)uVar10) {
            uVar17 = uVar14;
          }
          iVar4 = *piVar23;
          *puVar19 = uVar17;
          uVar10 = iVar3 - (int)((double)(iVar4 - iVar13) * 0.344 + (double)(iVar2 - iVar13) * 0.714
                                );
          uVar14 = uVar10;
          if ((int)uVar12 <= (int)uVar10) {
            uVar14 = uVar12;
          }
          uVar17 = 0;
          if (-1 < (int)uVar10) {
            uVar17 = uVar14;
          }
          *puVar20 = uVar17;
          uVar10 = iVar3 + (int)((double)(iVar4 - iVar13) * 1.772);
          uVar14 = uVar10;
          if ((int)uVar12 <= (int)uVar10) {
            uVar14 = uVar12;
          }
          uVar17 = 0;
          if (-1 < (int)uVar10) {
            uVar17 = uVar14;
          }
          *puVar24 = uVar17;
          iVar2 = piVar9[1];
          iVar3 = *piVar22;
          iVar4 = *piVar23;
          uVar10 = (int)((double)(iVar3 - iVar13) * 1.402) + iVar2;
          uVar14 = uVar10;
          if ((int)uVar12 <= (int)uVar10) {
            uVar14 = uVar12;
          }
          uVar17 = 0;
          if (-1 < (int)uVar10) {
            uVar17 = uVar14;
          }
          puVar19[1] = uVar17;
          uVar10 = iVar2 - (int)((double)(iVar4 - iVar13) * 0.344 + (double)(iVar3 - iVar13) * 0.714
                                );
          uVar14 = uVar10;
          if ((int)uVar12 <= (int)uVar10) {
            uVar14 = uVar12;
          }
          uVar17 = 0;
          if (-1 < (int)uVar10) {
            uVar17 = uVar14;
          }
          puVar20[1] = uVar17;
          uVar10 = iVar2 + (int)((double)(iVar4 - iVar13) * 1.772);
          uVar14 = uVar10;
          if ((int)uVar12 <= (int)uVar10) {
            uVar14 = uVar12;
          }
          uVar17 = 0;
          if (-1 < (int)uVar10) {
            uVar17 = uVar14;
          }
          puVar24[1] = uVar17;
          piVar9 = piVar9 + 2;
          puVar19 = puVar19 + 2;
          puVar20 = puVar20 + 2;
          puVar24 = puVar24 + 2;
          piVar23 = piVar23 + 1;
          piVar22 = piVar22 + 1;
          uVar11 = uVar11 + 2;
        } while (uVar11 < uVar16);
      }
      if (uVar11 < uVar15) {
        iVar2 = *piVar9;
        uVar10 = (int)((double)(*piVar22 - iVar13) * 1.402) + iVar2;
        uVar14 = uVar12;
        if ((int)uVar10 < (int)uVar12) {
          uVar14 = uVar10;
        }
        if ((int)uVar10 < 0) {
          uVar14 = 0;
        }
        uVar17 = iVar2 - (int)((double)(*piVar23 - iVar13) * 0.344 +
                              (double)(*piVar22 - iVar13) * 0.714);
        uVar10 = uVar12;
        if ((int)uVar17 < (int)uVar12) {
          uVar10 = uVar17;
        }
        if ((int)uVar17 < 0) {
          uVar10 = 0;
        }
        uVar18 = (int)((double)(*piVar23 - iVar13) * 1.772) + iVar2;
        uVar17 = uVar12;
        if ((int)uVar18 < (int)uVar12) {
          uVar17 = uVar18;
        }
        *puVar19 = uVar14;
        if ((int)uVar18 < 0) {
          uVar17 = 0;
        }
        *puVar20 = uVar10;
        *puVar24 = uVar17;
        piVar9 = piVar9 + 1;
        puVar19 = puVar19 + 1;
        puVar20 = puVar20 + 1;
        puVar24 = puVar24 + 1;
        piVar23 = piVar23 + 1;
        piVar22 = piVar22 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar21);
  }
  free(__ptr);
  poVar6 = img->comps;
  poVar6->data = (OPJ_INT32 *)__ptr_00;
  free(poVar6[1].data);
  poVar6 = img->comps;
  poVar6[1].data = (OPJ_INT32 *)__ptr_01;
  free(poVar6[2].data);
  poVar6 = img->comps;
  poVar6[2].data = (OPJ_INT32 *)__ptr_02;
  poVar6[2].w = poVar6->w;
  poVar6[1].w = poVar6->w;
  poVar6[2].h = poVar6->h;
  poVar6[1].h = poVar6->h;
  OVar5 = poVar6->dy;
  poVar6[2].dx = poVar6->dx;
  poVar6[1].dx = poVar6->dx;
  poVar6[2].dy = OVar5;
  poVar6[1].dy = OVar5;
  img->color_space = OPJ_CLRSPC_SRGB;
  return;
}

Assistant:

static void sycc422_to_rgb(opj_image_t *img)
{	
	int *d0, *d1, *d2, *r, *g, *b;
	const int *y, *cb, *cr;
	size_t maxw, maxh, max, offx, loopmaxw;
	int offset, upb;
	size_t i;

	upb = (int)img->comps[0].prec;
	offset = 1<<(upb - 1); upb = (1<<upb)-1;

	maxw = (size_t)img->comps[0].w; maxh = (size_t)img->comps[0].h;
	max = maxw * maxh;

	y = img->comps[0].data;
	cb = img->comps[1].data;
	cr = img->comps[2].data;

	d0 = r = (int*)malloc(sizeof(int) * max);
	d1 = g = (int*)malloc(sizeof(int) * max);
	d2 = b = (int*)malloc(sizeof(int) * max);

	if(r == NULL || g == NULL || b == NULL) goto fails;

	/* if img->x0 is odd, then first column shall use Cb/Cr = 0 */
	offx = img->x0 & 1U;
	loopmaxw = maxw - offx;
	
	for(i=0U; i < maxh; ++i)
	{
		size_t j;
		
		if (offx > 0U) {
			sycc_to_rgb(offset, upb, *y, 0, 0, r, g, b);
			++y; ++r; ++g; ++b;
		}
		
		for(j=0U; j < (loopmaxw & ~(size_t)1U); j += 2U)
		{
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b;
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b; ++cb; ++cr;
		}
		if (j < loopmaxw) {
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b; ++cb; ++cr;
		}
	}
	
	free(img->comps[0].data); img->comps[0].data = d0;
	free(img->comps[1].data); img->comps[1].data = d1;
	free(img->comps[2].data); img->comps[2].data = d2;

	img->comps[1].w = img->comps[2].w = img->comps[0].w;
	img->comps[1].h = img->comps[2].h = img->comps[0].h;
	img->comps[1].dx = img->comps[2].dx = img->comps[0].dx;
	img->comps[1].dy = img->comps[2].dy = img->comps[0].dy;
	img->color_space = OPJ_CLRSPC_SRGB;
	return;

fails:
	free(r);
	free(g);
	free(b);
}